

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

void __thiscall minibag::Bag::appendHeaderToBuffer(Bag *this,Buffer *buf,M_string *fields)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  element_type *__src;
  map *in_RDX;
  Buffer *in_RSI;
  uint32_t offset;
  uint32_t header_len;
  shared_ptr<unsigned_char[]> header_buffer;
  uint32_t in_stack_ffffffffffffff8c;
  Buffer *in_stack_ffffffffffffff90;
  uint local_2c;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> local_28;
  map *local_18;
  Buffer *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::shared_ptr<unsigned_char[]>::shared_ptr((shared_ptr<unsigned_char[]> *)0x165682);
  miniros::Header::write(local_18,(shared_ptr *)&local_28,&local_2c);
  uVar1 = Buffer::getSize(local_10);
  Buffer::getSize(local_10);
  Buffer::setSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  puVar2 = Buffer::getData(local_10);
  *(uint *)(puVar2 + uVar1) = local_2c;
  puVar2 = Buffer::getData(local_10);
  puVar2 = puVar2 + (uVar1 + 4);
  __src = std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get(&local_28);
  memcpy(puVar2,__src,(ulong)local_2c);
  std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x165756);
  return;
}

Assistant:

void Bag::appendHeaderToBuffer(Buffer& buf, M_string const& fields) {
    std::shared_ptr<uint8_t[]> header_buffer;
    uint32_t header_len;
    miniros::Header::write(fields, header_buffer, header_len);

    uint32_t offset = buf.getSize();

    buf.setSize(buf.getSize() + 4 + header_len);

    memcpy(buf.getData() + offset, &header_len, 4);
    offset += 4;
    memcpy(buf.getData() + offset, header_buffer.get(), header_len);
}